

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::SmallVector<std::function<void_()>,_0UL>::clear
          (SmallVector<std::function<void_()>,_0UL> *this)

{
  function<void_()> *pfVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  if ((this->super_VectorView<std::function<void_()>_>).buffer_size != 0) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      pfVar1 = (this->super_VectorView<std::function<void_()>_>).ptr;
      pcVar2 = *(code **)((long)&(pfVar1->super__Function_base)._M_manager + lVar4);
      if (pcVar2 != (code *)0x0) {
        lVar3 = (long)&(pfVar1->super__Function_base)._M_functor + lVar4;
        (*pcVar2)(lVar3,lVar3,3);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar5 < (this->super_VectorView<std::function<void_()>_>).buffer_size);
  }
  (this->super_VectorView<std::function<void_()>_>).buffer_size = 0;
  return;
}

Assistant:

void clear() SPIRV_CROSS_NOEXCEPT
	{
		for (size_t i = 0; i < this->buffer_size; i++)
			this->ptr[i].~T();
		this->buffer_size = 0;
	}